

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::BatchnormLayerParams::Clear(BatchnormLayerParams *this)

{
  if (this->gamma_ != (WeightParams *)0x0) {
    (*(this->gamma_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->gamma_ = (WeightParams *)0x0;
  if (this->beta_ != (WeightParams *)0x0) {
    (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->beta_ = (WeightParams *)0x0;
  if (this->mean_ != (WeightParams *)0x0) {
    (*(this->mean_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->mean_ = (WeightParams *)0x0;
  if (this->variance_ != (WeightParams *)0x0) {
    (*(this->variance_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->variance_ = (WeightParams *)0x0;
  this->channels_ = 0;
  this->computemeanvar_ = false;
  this->instancenormalization_ = false;
  *(undefined2 *)&this->field_0x3a = 0;
  this->epsilon_ = 0.0;
  return;
}

Assistant:

void BatchnormLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BatchnormLayerParams)
  if (GetArenaNoVirtual() == NULL && gamma_ != NULL) {
    delete gamma_;
  }
  gamma_ = NULL;
  if (GetArenaNoVirtual() == NULL && beta_ != NULL) {
    delete beta_;
  }
  beta_ = NULL;
  if (GetArenaNoVirtual() == NULL && mean_ != NULL) {
    delete mean_;
  }
  mean_ = NULL;
  if (GetArenaNoVirtual() == NULL && variance_ != NULL) {
    delete variance_;
  }
  variance_ = NULL;
  ::memset(&channels_, 0, reinterpret_cast<char*>(&epsilon_) -
    reinterpret_cast<char*>(&channels_) + sizeof(epsilon_));
}